

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O2

array_t<unsigned_char,_16> __thiscall
CoreML::MilStoragePython::MilStoragePythonReader::read_uint6_data
          (MilStoragePythonReader *this,uint64_t offset)

{
  uint64_t in_RDX;
  Span<const_MILBlob::UInt6,_18446744073709551615UL> SVar1;
  Span<const_unsigned_char,_18446744073709551615UL> SVar2;
  Span<const_MILBlob::UInt6,_18446744073709551615UL> span;
  vector<MILBlob::UInt6,_std::allocator<MILBlob::UInt6>_> unpackedUIntSubByteData;
  allocator_type local_41;
  _Vector_base<MILBlob::UInt6,_std::allocator<MILBlob::UInt6>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  SVar1 = MILBlob::Blob::StorageReader::GetDataView<MILBlob::UInt6>
                    (*(StorageReader **)offset,in_RDX);
  span.m_size = SVar1.m_size.m_size;
  span.m_ptr = (type)span.m_size.m_size;
  SVar2 = MILBlob::Util::CastFromBitSpan<const_MILBlob::UInt6,_true>((Util *)SVar1.m_ptr,span);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,SVar2.m_ptr,
             SVar2.m_ptr + SVar2.m_size.m_size.m_size,&local_41);
  MILBlob::UnPackSubByteVec<MILBlob::UInt6>
            ((vector<MILBlob::UInt6,_std::allocator<MILBlob::UInt6>_> *)&local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,span.m_size.m_size);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  pybind11::array_t<unsigned_char,_16>::array_t
            ((array_t<unsigned_char,_16> *)this,
             (long)local_40._M_impl.super__Vector_impl_data._M_finish -
             (long)local_40._M_impl.super__Vector_impl_data._M_start,
             &(local_40._M_impl.super__Vector_impl_data._M_start)->data,(handle)0x0);
  std::_Vector_base<MILBlob::UInt6,_std::allocator<MILBlob::UInt6>_>::~_Vector_base(&local_40);
  return (array)(array)this;
}

Assistant:

py::array_t<uint8_t> MilStoragePythonReader::read_uint6_data(uint64_t offset) {
    return readUnsignedSubByteData<MILBlob::UInt6>(*m_reader, offset);
}